

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  bool bVar21;
  char buffer [4];
  undefined4 local_34;
  
  if (hbSize < 4) {
    local_34 = 0;
    memcpy(&local_34,headerBuffer,hbSize);
    sVar4 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,&local_34,4);
    sVar6 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sVar6 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sVar6 = sVar4;
    }
  }
  else {
    memset(normalizedCounter,0,(ulong)(*maxSVPtr + 1) * 2);
    uVar20 = *headerBuffer;
    uVar17 = uVar20 & 0xf;
    sVar6 = 0xffffffffffffffd4;
    if (uVar17 < 0xb) {
      iVar12 = 0x20 << (sbyte)uVar17;
      *tableLogPtr = uVar17 + 5;
      uVar3 = *maxSVPtr;
      iVar19 = iVar12 + 1;
      iVar18 = uVar17 + 6;
      uVar20 = uVar20 >> 4;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar14 = (uint *)((long)headerBuffer + (hbSize - 4));
      uVar17 = 4;
      bVar21 = true;
      uVar5 = 0;
      puVar15 = (uint *)headerBuffer;
      do {
        uVar11 = uVar5;
        if (!bVar21) {
          while ((short)uVar20 == -1) {
            if (puVar15 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar16 = (uint *)((long)puVar15 + 2);
              puVar15 = (uint *)((long)puVar15 + 2);
              uVar20 = *puVar16 >> ((byte)uVar17 & 0x1f);
            }
            else {
              uVar20 = uVar20 >> 0x10;
              uVar17 = uVar17 + 0x10;
            }
            uVar11 = (ulong)((int)uVar11 + 0x18);
          }
          while( true ) {
            uVar7 = uVar20 & 3;
            iVar9 = (int)uVar11;
            if (uVar7 != 3) break;
            uVar11 = (ulong)(iVar9 + 3);
            uVar20 = uVar20 >> 2;
            uVar17 = uVar17 + 2;
          }
          uVar8 = iVar9 + uVar7;
          if (uVar3 < uVar8) {
            return 0xffffffffffffffd0;
          }
          if ((uint)uVar5 < uVar8) {
            memset(normalizedCounter + uVar5,0,(ulong)(~(uint)uVar5 + iVar9 + uVar7) * 2 + 2);
            uVar5 = (ulong)uVar8;
          }
          uVar17 = uVar17 + 2;
          iVar9 = (int)uVar17 >> 3;
          puVar16 = (uint *)((long)puVar15 + (long)iVar9);
          if ((puVar2 < puVar15) && (puVar14 < puVar16)) {
            uVar20 = uVar20 >> 2;
          }
          else {
            if (3 < iVar9) {
              __assert_fail("(bitCount >> 3) <= 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0xa16,
                            "size_t FSE_readNCount(short *, unsigned int *, unsigned int *, const void *, size_t)"
                           );
            }
            uVar17 = uVar17 & 7;
            uVar20 = *(uint *)((long)puVar15 + (long)iVar9) >> (sbyte)uVar17;
            puVar15 = puVar16;
          }
        }
        uVar7 = iVar12 * 2 - 1;
        uVar8 = uVar7 - iVar19;
        uVar10 = iVar12 - 1U & uVar20;
        if (uVar10 < uVar8) {
          iVar9 = iVar18 + -1;
        }
        else {
          uVar20 = uVar20 & uVar7;
          if ((int)uVar20 < iVar12) {
            uVar8 = 0;
          }
          uVar10 = uVar20 - uVar8;
          iVar9 = iVar18;
        }
        iVar1 = uVar10 - 1;
        iVar13 = 1 - uVar10;
        if (0 < (int)uVar10) {
          iVar13 = iVar1;
        }
        iVar19 = iVar19 - iVar13;
        uVar7 = (uint)uVar5;
        normalizedCounter[uVar5] = (short)iVar1;
        bVar21 = iVar1 != 0;
        for (; iVar19 < iVar12; iVar12 = iVar12 >> 1) {
          iVar18 = iVar18 + -1;
        }
        uVar20 = iVar9 + uVar17;
        puVar16 = (uint *)((long)((int)uVar20 >> 3) + (long)puVar15);
        uVar17 = uVar20 & 7;
        if (puVar2 < puVar15 && puVar14 < puVar16) {
          puVar16 = puVar14;
          uVar17 = uVar20 + ((int)puVar15 - (int)puVar14) * 8;
        }
        uVar20 = *puVar16 >> ((byte)uVar17 & 0x1f);
      } while ((1 < iVar19) &&
              (uVar8 = uVar7 + 1, uVar5 = (ulong)uVar8, puVar15 = puVar16, uVar8 <= uVar3));
      sVar6 = 0xffffffffffffffec;
      if ((iVar19 == 1) && ((int)uVar17 < 0x21)) {
        *maxSVPtr = uVar7;
        sVar6 = (long)puVar16 + ((long)((int)(uVar17 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    /* init */
    memset(normalizedCounter, 0, (*maxSVPtr+1) * sizeof(normalizedCounter[0]));   /* all symbols not present in NCount have a frequency of 0 */
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}